

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O1

void __thiscall mnf::RealSpace::RealSpace(RealSpace *this,Index n,ConstRefVec *magnitude)

{
  bool bVar1;
  uint uVar2;
  long *plVar3;
  string *this_00;
  double *pdVar4;
  undefined8 uVar5;
  ulong uVar6;
  long *plVar7;
  ulong __val;
  uint __len;
  string __str;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  Manifold::Manifold(&this->super_Manifold,n,n,n);
  (this->super_Manifold)._vptr_Manifold = (_func_int **)&PTR__RealSpace_001419d0;
  (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_data = (double *)0x0;
  (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
  .m_rows = 0;
  (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  if ((magnitude->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value != n) {
    uVar5 = __cxa_allocate_exception(1);
    __cxa_throw(uVar5,&mnf_exception::typeinfo,0);
  }
  __val = -n;
  if (0 < n) {
    __val = n;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00129a21;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00129a21;
      }
      if (uVar6 < 10000) goto LAB_00129a21;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_00129a21:
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)(n >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>(local_70[0] + -(n >> 0x3f),__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x135c30);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_40 = *plVar7;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  this_00 = Manifold::name_abi_cxx11_(&this->super_Manifold);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (-1 < n) {
    if ((this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows != n) {
      free((this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (n == 0) {
        pdVar4 = (double *)0x0;
      }
      else {
        pdVar4 = Eigen::internal::conditional_aligned_new_auto<double,true>(n);
      }
      (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data = pdVar4;
    }
    (this->typicalMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = n;
    setTypicalMagnitude(this,magnitude);
    if ((this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows != n) {
      free((this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (n == 0) {
        pdVar4 = (double *)0x0;
      }
      else {
        pdVar4 = Eigen::internal::conditional_aligned_new_auto<double,true>(n);
      }
      (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data = pdVar4;
    }
    (this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
    .m_rows = n;
    setTrustMagnitude(this,magnitude);
    return;
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

RealSpace::RealSpace(Index n, const ConstRefVec& magnitude) : Manifold(n, n, n)
{
  mnf_assert(magnitude.size() == n && "magnitude on R^n must be of size n");
  name() = "R" + std::to_string(n);
  typicalMagnitude_.resize(n);
  setTypicalMagnitude(magnitude);
  trustMagnitude_.resize(n);
  setTrustMagnitude(magnitude);
}